

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_multi_var
              (secp256k1_ecmult_context *ctx,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  code *pcVar6;
  size_t sVar7;
  secp256k1_fe *psVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  secp256k1_ge point;
  secp256k1_scalar scalar;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  secp256k1_fe zr [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_state local_e00;
  secp256k1_ge local_de0;
  secp256k1_scalar local_d88;
  secp256k1_gej local_d68;
  secp256k1_scalar local_ce8;
  secp256k1_gej local_cc8;
  secp256k1_fe local_c48 [8];
  secp256k1_strauss_point_state local_b08;
  secp256k1_ge local_6f8 [8];
  secp256k1_gej local_438 [8];
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  iVar2 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n == 0) {
      local_d68.x.n[2] = 0;
      local_d68.x.n[3] = 0;
      local_d68.x.n[0] = 0;
      local_d68.x.n[1] = 0;
      local_cc8.x.n[0] = (uint64_t)local_438;
      local_cc8.x.n[1] = (uint64_t)local_c48;
      local_cc8.x.n[2] = (uint64_t)local_6f8;
      local_cc8.x.n[3] = (uint64_t)&local_b08;
      iVar2 = 1;
      secp256k1_ecmult_strauss_wnaf
                (ctx,(secp256k1_strauss_state *)&local_cc8,r,1,r,(secp256k1_scalar *)&local_d68,
                 inp_g_sc);
    }
    else if (scratch == (secp256k1_scratch *)0x0) {
      local_ce8.d[0] = 0;
      local_ce8.d[1] = 0;
      local_ce8.d[2] = 0;
      local_ce8.d[3] = 0;
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      (r->x).n[4] = 0;
      (r->y).n[0] = 0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      local_d68.x.n[0] = (uint64_t)local_438;
      local_d68.x.n[1] = (uint64_t)local_c48;
      local_d68.x.n[2] = (uint64_t)local_6f8;
      local_d68.x.n[3] = (uint64_t)&local_b08;
      secp256k1_ecmult_strauss_wnaf
                (ctx,(secp256k1_strauss_state *)&local_d68,r,1,&local_cc8,&local_ce8,inp_g_sc);
      sVar12 = 0;
      do {
        iVar2 = (*cb)(&local_d88,&local_de0,sVar12,cbdata);
        if (iVar2 == 0) goto LAB_00114479;
        local_d68.infinity = local_de0.infinity;
        local_d68.x.n[4] = local_de0.x.n[4];
        local_d68.x.n[2] = local_de0.x.n[2];
        local_d68.x.n[3] = local_de0.x.n[3];
        local_d68.x.n[0] = local_de0.x.n[0];
        local_d68.x.n[1] = local_de0.x.n[1];
        local_d68.y.n[4] = local_de0.y.n[4];
        local_d68.y.n[2] = local_de0.y.n[2];
        local_d68.y.n[3] = local_de0.y.n[3];
        local_d68.y.n[0] = local_de0.y.n[0];
        local_d68.y.n[1] = local_de0.y.n[1];
        local_d68.z.n[0] = 1;
        local_d68.z.n[3] = 0;
        local_d68.z.n[4] = 0;
        local_d68.z.n[1] = 0;
        local_d68.z.n[2] = 0;
        local_e00.prej = local_438;
        local_e00.zr = local_c48;
        local_e00.pre_a = local_6f8;
        local_e00.ps = &local_b08;
        iVar2 = 1;
        psVar8 = (secp256k1_fe *)0x1;
        secp256k1_ecmult_strauss_wnaf
                  (ctx,&local_e00,&local_cc8,1,&local_d68,&local_d88,(secp256k1_scalar *)0x0);
        secp256k1_gej_add_var(r,r,&local_cc8,psVar8);
        sVar12 = sVar12 + 1;
      } while (n != sVar12);
    }
    else {
      sVar12 = scratch->frame;
      lVar3 = 0;
      if (sVar12 != 0) {
        sVar7 = 0;
        do {
          lVar3 = lVar3 + scratch->frame_size[sVar7];
          sVar7 = sVar7 + 1;
        } while (sVar12 != sVar7);
      }
      uVar10 = scratch->max_size - lVar3;
      uVar5 = uVar10 - 0x60;
      if (uVar10 < 0x60) {
        uVar5 = 0;
      }
      uVar9 = 1;
      uVar10 = 0;
      do {
        iVar2 = (int)uVar9;
        uVar11 = uVar9;
        switch(iVar2) {
        case 1:
          break;
        case 2:
          uVar11 = 0xb;
          break;
        case 3:
          uVar11 = 0x2d;
          break;
        case 4:
          uVar11 = 100;
          break;
        case 5:
          uVar11 = 0x113;
          break;
        case 6:
          uVar11 = 0x271;
          break;
        case 7:
          uVar11 = 0x73a;
          break;
        case 8:
          uVar11 = 0xd48;
          break;
        case 9:
          uVar11 = 0x259e;
          break;
        case 10:
          uVar11 = 0x45ec;
          break;
        case 0xb:
          uVar11 = 0x8020;
          break;
        case 0xc:
          uVar11 = 0xffffffffffffffff;
          break;
        case 0xd:
          goto switchD_00114053_caseD_d;
        default:
          uVar11 = 0;
        }
        uVar1 = (short)((iVar2 + 0x100U & 0xffff) / (iVar2 + 1U & 0xffff)) * 4 + 0x8c;
        uVar9 = (ulong)((0x80 << ((byte)uVar9 & 0x1f)) + (uint)uVar1 + 0x10);
        if (uVar5 < uVar9) break;
        uVar4 = (uVar5 - uVar9) / (ulong)uVar1;
        uVar9 = uVar11;
        if (uVar4 < uVar11) {
          uVar9 = uVar4;
        }
        if (uVar10 < uVar9) {
          uVar10 = uVar9;
        }
        uVar9 = (ulong)(iVar2 + 1);
      } while (uVar11 <= uVar4);
switchD_00114053_caseD_d:
      if (uVar10 == 0) {
LAB_00114479:
        iVar2 = 0;
      }
      else {
        uVar5 = 10000000;
        if (uVar10 < 10000000) {
          uVar5 = uVar10;
        }
        uVar5 = ((n + uVar5) - 1) / uVar5;
        uVar10 = ((uVar5 + n) - 1) / uVar5;
        if (uVar10 < 0xa0) {
          lVar3 = 0;
          if (sVar12 != 0) {
            sVar7 = 0;
            do {
              lVar3 = lVar3 + scratch->frame_size[sVar7];
              sVar7 = sVar7 + 1;
            } while (sVar12 != sVar7);
          }
          uVar10 = scratch->max_size - lVar3;
          uVar5 = 0;
          if (0x5f < uVar10) {
            uVar5 = uVar10 - 0x60;
          }
          if (uVar5 < 0xcb0) {
            return 0;
          }
          uVar5 = ((n - 1) + uVar5 / 0xcb0) / (uVar5 / 0xcb0);
          uVar10 = ((n - 1) + uVar5) / uVar5;
          pcVar6 = secp256k1_ecmult_strauss_batch;
        }
        else {
          pcVar6 = secp256k1_ecmult_pippenger_batch;
        }
        lVar13 = 0;
        lVar3 = 0;
        do {
          uVar9 = uVar10;
          if (n < uVar10) {
            uVar9 = n;
          }
          psVar8 = (secp256k1_fe *)0x0;
          if (lVar3 == 0) {
            psVar8 = (secp256k1_fe *)inp_g_sc;
          }
          iVar2 = (*pcVar6)(ctx,scratch,&local_b08,psVar8,cb,cbdata,uVar9,lVar13);
          if (iVar2 == 0) goto LAB_00114479;
          secp256k1_gej_add_var(r,r,(secp256k1_gej *)&local_b08,psVar8);
          n = n - uVar9;
          lVar3 = lVar3 + 1;
          lVar13 = lVar13 + uVar10;
        } while (uVar5 + (uVar5 == 0) != lVar3);
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_ecmult_context *ctx, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_ecmult_context*, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t max_points;
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_scalar szero;
        secp256k1_scalar_set_int(&szero, 0);
        secp256k1_ecmult(ctx, r, r, &szero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_var_simple(ctx, r, inp_g_sc, cb, cbdata, n);
    }

    max_points = secp256k1_pippenger_max_points(scratch);
    if (max_points == 0) {
        return 0;
    } else if (max_points > ECMULT_MAX_POINTS_PER_BATCH) {
        max_points = ECMULT_MAX_POINTS_PER_BATCH;
    }
    n_batches = (n+max_points-1)/max_points;
    n_batch_points = (n+n_batches-1)/n_batches;

    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        max_points = secp256k1_strauss_max_points(scratch);
        if (max_points == 0) {
            return 0;
        }
        n_batches = (n+max_points-1)/max_points;
        n_batch_points = (n+n_batches-1)/n_batches;
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(ctx, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}